

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_listener_base.cpp
# Opt level: O0

void __thiscall zmq::stream_listener_base_t::~stream_listener_base_t(stream_listener_base_t *this)

{
  undefined8 *in_RDI;
  own_t *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__stream_listener_base_t_002c92c0;
  in_RDI[0xad] = &DAT_002c93a8;
  if (*(int *)(in_RDI + 0xaf) != -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s == retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_listener_base.cpp"
            ,0x39);
    fflush(_stderr);
    zmq_abort((char *)0x222dd9);
  }
  if (in_RDI[0xb0] != 0) {
    in_stack_ffffffffffffffe0 = (own_t *)&stderr;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_handle",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_listener_base.cpp"
            ,0x3a);
    fflush((FILE *)(in_stack_ffffffffffffffe0->super_object_t)._vptr_object_t);
    zmq_abort((char *)0x222e49);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0xb2));
  io_object_t::~io_object_t((io_object_t *)0x222e73);
  own_t::~own_t(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

zmq::stream_listener_base_t::~stream_listener_base_t ()
{
    zmq_assert (_s == retired_fd);
    zmq_assert (!_handle);
}